

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

int Mio_CollectRootsNewDefault3(int nInputs,Vec_Ptr_t **pvNames,Vec_Wrd_t **pvTruths)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  uint nCap;
  uint uVar3;
  Mio_Library_t *pLib;
  void *__ptr;
  Mio_Gate_t *pGate;
  Vec_Ptr_t *pVVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  word wVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  
  nCap = 0;
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib != (Mio_Library_t *)0x0) {
    nCap = Mio_LibraryReadGateNum(pLib);
    __ptr = calloc((long)(int)nCap,8);
    for (pGate = Mio_LibraryReadGates(pLib); pGate != (Mio_Gate_t *)0x0;
        pGate = Mio_GateReadNext(pGate)) {
      *(Mio_Gate_t **)((long)__ptr + (long)pGate->Cell * 8) = pGate;
    }
    pVVar4 = Vec_PtrAlloc(nCap);
    *pvNames = pVVar4;
    iVar10 = nCap * 4;
    pVVar5 = Vec_WrdAlloc(iVar10);
    pVVar5->nSize = iVar10;
    uVar11 = 0;
    memset(pVVar5->pArray,0,(long)iVar10 << 3);
    *pvTruths = pVVar5;
    uVar8 = 0;
    if (0 < (int)nCap) {
      uVar8 = (ulong)nCap;
    }
    uVar9 = 0;
    for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      puVar1 = *(undefined8 **)((long)__ptr + uVar11 * 8);
      if ((*(int *)((long)puVar1 + 0x44) <= nInputs) && (puVar1[7] == 0)) {
        Vec_PtrPush(*pvNames,(void *)*puVar1);
        if ((int)uVar9 < 0) {
LAB_0034ec98:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar3 = uVar9 * 4;
        if ((*pvTruths)->nSize <= (int)uVar3) goto LAB_0034ec98;
        uVar9 = uVar9 + 1;
        pwVar6 = (*pvTruths)->pArray + uVar3;
        iVar10 = *(int *)((long)puVar1 + 0x44);
        if (iVar10 < 7) {
          uVar12 = *(undefined4 *)(puVar1 + 0xd);
          uVar13 = *(undefined4 *)((long)puVar1 + 0x6c);
          *(undefined4 *)(pwVar6 + 2) = uVar12;
          *(undefined4 *)((long)pwVar6 + 0x14) = uVar13;
          *(undefined4 *)(pwVar6 + 3) = uVar12;
          *(undefined4 *)((long)pwVar6 + 0x1c) = uVar13;
          uVar14 = uVar12;
          uVar15 = uVar13;
        }
        else {
          if (iVar10 != 8) {
            if (iVar10 == 7) {
              wVar7 = *(word *)puVar1[0xd];
              pwVar6[2] = wVar7;
              *pwVar6 = wVar7;
              wVar7 = *(word *)(puVar1[0xd] + 8);
              pwVar6[3] = wVar7;
              pwVar6[1] = wVar7;
            }
            goto LAB_0034ec01;
          }
          puVar2 = (undefined4 *)puVar1[0xd];
          uVar12 = *puVar2;
          uVar13 = puVar2[1];
          uVar14 = puVar2[2];
          uVar15 = puVar2[3];
          wVar7 = *(word *)(puVar2 + 6);
          pwVar6[2] = *(word *)(puVar2 + 4);
          pwVar6[3] = wVar7;
        }
        *(undefined4 *)pwVar6 = uVar12;
        *(undefined4 *)((long)pwVar6 + 4) = uVar13;
        *(undefined4 *)(pwVar6 + 1) = uVar14;
        *(undefined4 *)((long)pwVar6 + 0xc) = uVar15;
      }
LAB_0034ec01:
    }
    if (uVar9 != nCap) {
      __assert_fail("iGate == nGates",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                    ,0x337,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    wVar7 = Vec_WrdEntry(*pvTruths,0);
    if (wVar7 != 0) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                    ,0x338,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    wVar7 = Vec_WrdEntry(*pvTruths,4);
    if (wVar7 != 0xffffffffffffffff) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 4) == ~(word)0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                    ,0x339,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    wVar7 = Vec_WrdEntry(*pvTruths,8);
    if (wVar7 != 0xaaaaaaaaaaaaaaaa) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 8) == s_Truths6[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                    ,0x33a,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    wVar7 = Vec_WrdEntry(*pvTruths,0xc);
    if (wVar7 != 0x5555555555555555) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 12) == ~s_Truths6[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                    ,0x33b,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    free(__ptr);
  }
  return nCap;
}

Assistant:

int Mio_CollectRootsNewDefault3( int nInputs, Vec_Ptr_t ** pvNames, Vec_Wrd_t ** pvTruths )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    int i, iGate = 0, nGates = pLib ? Mio_LibraryReadGateNum( pLib ) : 0;
    Mio_Gate_t * pGate0, ** ppGates; word * pTruth;
    if ( pLib == NULL )
        return 0;
    ppGates = ABC_CALLOC( Mio_Gate_t *, nGates );
    Mio_LibraryForEachGate( pLib, pGate0 )
        ppGates[pGate0->Cell] = pGate0;
    *pvNames  = Vec_PtrAlloc( nGates );
    *pvTruths = Vec_WrdStart( nGates * 4 );
    for ( i = 0; i < nGates; i++ )
    {
        pGate0 = ppGates[i];
        if ( pGate0->nInputs > nInputs || pGate0->pTwin ) // skip large and multi-output
            continue;
        Vec_PtrPush( *pvNames, pGate0->pName );
        pTruth = Vec_WrdEntryP( *pvTruths, iGate++*4 );
        if ( pGate0->nInputs <= 6 )
            pTruth[0] = pTruth[1] = pTruth[2] = pTruth[3] = pGate0->uTruth;
        else if ( pGate0->nInputs == 7 )
        {
            pTruth[0] = pTruth[2] = pGate0->pTruth[0];
            pTruth[1] = pTruth[3] = pGate0->pTruth[1];
        }
        else if ( pGate0->nInputs == 8 )
            memcpy( pTruth, pGate0->pTruth, (size_t)(4*sizeof(word)) );
    }
    assert( iGate == nGates );
    assert( Vec_WrdEntry(*pvTruths,  0) ==        0 );
    assert( Vec_WrdEntry(*pvTruths,  4) == ~(word)0 );
    assert( Vec_WrdEntry(*pvTruths,  8) ==  s_Truths6[0] );
    assert( Vec_WrdEntry(*pvTruths, 12) == ~s_Truths6[0] );
    ABC_FREE( ppGates );
    return nGates;
}